

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

NESTresult * __thiscall
NEST::NESTcalc::GetYieldERdEOdxBasis
          (NESTresult *__return_storage_ptr__,NESTcalc *this,
          vector<double,_std::allocator<double>_> *dEOdxParam,string *muonInitPos,
          vector<double,_std::allocator<double>_> *vTable,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  QuantaResult *pQVar1;
  double dVar2;
  double a;
  double dVar3;
  double dVar4;
  int iVar5;
  pointer pdVar6;
  VDetector *pVVar7;
  pointer pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  bool bVar13;
  long lVar14;
  NESTcalc *pNVar15;
  RandomGen *pRVar16;
  int64_t iVar17;
  double *pdVar18;
  runtime_error *this_00;
  int iVar19;
  NESTcalc *pNVar20;
  double *pdVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  float fVar26;
  double dVar27;
  double dVar28;
  double extraout_XMM0_Qa;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double extraout_XMM0_Qa_00;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  double dVar39;
  double dVar40;
  int local_21c;
  undefined1 local_218 [16];
  double local_1c8;
  double local_1b8;
  undefined8 local_1a8;
  undefined1 local_188 [16];
  double local_178;
  double local_158;
  double local_150;
  undefined1 local_148 [12];
  undefined4 uStack_13c;
  string position;
  double local_108;
  double dStack_100;
  string delimiter;
  double dStack_80;
  string token;
  
  bVar13 = this->fdetector->OldW13eV;
  pNVar15 = (NESTcalc *)(ulong)bVar13;
  pNVar20 = this;
  WorkFunction((dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[8],this->fdetector->molarMass,bVar13);
  iVar24 = (int)pNVar20;
  pdVar6 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = pdVar6[8];
  local_1a8 = this->fdetector->TopDrift;
  a = pdVar6[4];
  dVar3 = pdVar6[5];
  dVar33 = pdVar6[6];
  bVar13 = ValidityTests::nearlyEqual(a,0.0,1e-09);
  if ((NAN(a)) || (bVar13)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Energy cannot be zero or undefined");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->quanta).recombProb = 0.0;
  (__return_storage_ptr__->quanta).Variance = 0.0;
  (__return_storage_ptr__->quanta).photons = 0;
  (__return_storage_ptr__->quanta).electrons = 0;
  (__return_storage_ptr__->quanta).ions = 0;
  (__return_storage_ptr__->quanta).excitons = 0;
  (__return_storage_ptr__->yields).ElectricField = 0.0;
  (__return_storage_ptr__->yields).DeltaT_Scint = 0.0;
  (__return_storage_ptr__->yields).ExcitonRatio = 0.0;
  (__return_storage_ptr__->yields).Lindhard = 0.0;
  (__return_storage_ptr__->yields).PhotonYield = 0.0;
  (__return_storage_ptr__->yields).ElectronYield = 0.0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar18 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  dVar11 = *pdVar18;
  dVar12 = pdVar18[1];
  dVar4 = pdVar18[2];
  bVar13 = ValidityTests::nearlyEqual(pdVar18[3],-1.0,1e-09);
  if (bVar13) {
    if ((0.0 <= a) ||
       (pdVar18 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start, 0.0 < *pdVar18 || *pdVar18 == 0.0)) {
      dVar28 = this->fdetector->radmax;
      pRVar16 = RandomGen::rndm();
      dVar27 = RandomGen::rand_uniform(pRVar16);
      if (dVar27 < 0.0) {
        dVar27 = sqrt(dVar27);
      }
      else {
        dVar27 = SQRT(dVar27);
      }
      pNVar15 = (NESTcalc *)RandomGen::rndm();
      dVar36 = RandomGen::rand_uniform((RandomGen *)pNVar15);
      dVar28 = dVar28 * dVar27;
      dVar27 = cos(dVar36 * 6.283185307179586);
      dVar36 = sin(dVar36 * 6.283185307179586);
      local_188._8_8_ = dVar36 * dVar28;
      local_188._0_8_ = dVar27 * dVar28;
      goto LAB_00106921;
    }
    local_188._8_8_ = dVar12;
    local_188._0_8_ = dVar11 + -10.0;
    local_1a8._0_4_ = SUB84(dVar4,0);
    local_1a8._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
  }
  else {
    std::__cxx11::string::string((string *)&position,(string *)muonInitPos);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&delimiter,",",(allocator<char> *)&token);
    local_188._8_8_ = 0xc08f380000000000;
    local_188._0_8_ = 0xc08f380000000000;
    iVar24 = 0;
    while (lVar14 = std::__cxx11::string::find((string *)&position,(ulong)&delimiter), lVar14 != -1)
    {
      std::__cxx11::string::substr((ulong)&token,(ulong)&position);
      bVar13 = iVar24 == 0;
      iVar24 = iVar24 + -1;
      if (bVar13) {
        fVar26 = std::__cxx11::stof(&token,(size_t *)0x0);
        local_188._0_8_ = (double)fVar26;
        dVar28 = (double)local_188._8_8_;
      }
      else {
        fVar26 = std::__cxx11::stof(&token,(size_t *)0x0);
        dVar28 = (double)fVar26;
      }
      local_188._8_4_ = SUB84(dVar28,0);
      local_188._12_4_ = (int)((ulong)dVar28 >> 0x20);
      std::__cxx11::string::erase((ulong)&position,0);
      std::__cxx11::string::~string((string *)&token);
    }
    iVar24 = 0;
    fVar26 = std::__cxx11::stof(&position,(size_t *)0x0);
    local_1a8 = (double)fVar26;
    std::__cxx11::string::~string((string *)&delimiter);
    pNVar15 = (NESTcalc *)&position;
    std::__cxx11::string::~string((string *)pNVar15);
LAB_00106921:
  }
  if ((double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8) <= 0.0) {
    local_1a8 = this->fdetector->TopDrift;
  }
  if (0.0 <= a) {
    local_178 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[9];
    local_218._0_8_ = dVar2 * a * dVar3 * 100.0;
    goto LAB_00106a8f;
  }
  local_178 = -a;
  pdVar6 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar28 = pdVar6[10];
  if (dVar28 <= 0.0) {
LAB_00106a1a:
    dVar28 = CalcElectronLET(pNVar15,local_178,iVar24,(bool)(-(dVar28 != 0.0) & 1));
  }
  else {
    dVar27 = pdVar6[0xb];
    if ((dVar27 == 0.0) && (!NAN(dVar27))) goto LAB_00106a1a;
    dVar27 = pow(local_178,dVar27);
    dVar28 = dVar28 * dVar27;
  }
  pRVar16 = RandomGen::rndm();
  local_218._0_8_ = RandomGen::rand_zero_trunc_gauss(pRVar16,dVar28,dVar28);
  local_218._0_8_ = dVar2 * dVar3 * 100.0 * (double)local_218._0_8_;
LAB_00106a8f:
  local_148._0_8_ = -a;
  local_148._8_4_ = 0;
  uStack_13c = 0x80000000;
  local_218._8_8_ = 0;
  pQVar1 = &__return_storage_ptr__->quanta;
  dVar28 = 0.0;
  if (0.0 <= dVar4) {
    dVar28 = dVar4;
  }
  auVar34._0_8_ = dVar11 - (double)local_188._0_8_;
  auVar34._8_8_ = dVar12 - (double)local_188._8_8_;
  dVar40 = dVar28 - local_1a8;
  dVar4 = SQRT(dVar40 * dVar40 + auVar34._0_8_ * auVar34._0_8_ + auVar34._8_8_ * auVar34._8_8_);
  auVar35._8_4_ = SUB84(dVar4,0);
  auVar35._0_8_ = dVar4;
  auVar35._12_4_ = (int)((ulong)dVar4 >> 0x20);
  auVar35 = divpd(auVar34,auVar35);
  dVar27 = dVar3 * auVar35._0_8_;
  dVar36 = dVar3 * auVar35._8_8_;
  auVar9._8_4_ = SUB84(dVar36,0);
  auVar9._0_8_ = dVar27;
  auVar9._12_4_ = (int)((ulong)dVar36 >> 0x20);
  iVar24 = 0;
  local_150 = 0.0;
  local_21c = 0;
  local_1b8 = local_1a8;
  dVar36 = (double)local_188._0_8_;
  dVar38 = (double)local_188._8_8_;
  do {
    do {
      pVVar7 = this->fdetector;
      if (((pVVar7->radmax * pVVar7->radmax <= dVar36 * dVar36 + dVar38 * dVar38) ||
          (ABS(local_178) <= 1e-06)) ||
         (((dVar28 < local_1a8 && local_1b8 <= dVar28 || (local_1a8 < dVar28 && dVar28 <= local_1b8)
           ) && ((dVar36 - dVar11) * (dVar36 - dVar11) + (dVar38 - dVar12) * (dVar38 - dVar12) <
                 dVar3 * 4.0 * dVar3)))) {
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        iVar19 = 0;
        if (0 < local_21c) {
          iVar19 = local_21c;
        }
        (__return_storage_ptr__->quanta).photons = iVar24;
        (__return_storage_ptr__->quanta).electrons = iVar19;
        if ((dVar33 == -1.0) && (!NAN(dVar33))) {
          (*pVVar7->_vptr_VDetector[4])
                    (((double)local_188._0_8_ + dVar36) * 0.5,
                     SUB84(((double)local_188._8_8_ + dVar38) * 0.5,0));
          dVar33 = extraout_XMM0_Qa_00;
        }
        (__return_storage_ptr__->yields).DeltaT_Scint = (local_1a8 + local_1b8) * 0.5;
        (__return_storage_ptr__->yields).ElectricField = dVar33;
        return __return_storage_ptr__;
      }
      dVar31 = dVar33;
      if ((dVar33 == -1.0) && (!NAN(dVar33))) {
        (*pVVar7->_vptr_VDetector[4])(dVar36,SUB84(dVar38,0),local_1b8);
        dVar31 = extraout_XMM0_Qa;
      }
      if (0.0 <= a) {
        (*this->_vptr_NESTcalc[10])(&position,this,&default_ERYieldsParam);
        (__return_storage_ptr__->yields).ElectricField = local_108;
        (__return_storage_ptr__->yields).DeltaT_Scint = dStack_100;
        (__return_storage_ptr__->yields).ExcitonRatio =
             (double)position.field_2._M_allocated_capacity;
        (__return_storage_ptr__->yields).Lindhard = (double)position.field_2._8_8_;
        (__return_storage_ptr__->yields).PhotonYield = (double)position._M_dataplus._M_p;
        (__return_storage_ptr__->yields).ElectronYield = (double)position._M_string_length;
LAB_0010703b:
        (*this->_vptr_NESTcalc[0xc])
                  (dVar2,0,&position,this,__return_storage_ptr__,&default_NRERWidthsParam);
        (__return_storage_ptr__->quanta).recombProb = (double)position.field_2._M_allocated_capacity
        ;
        (__return_storage_ptr__->quanta).Variance = (double)position.field_2._8_8_;
        *(pointer *)pQVar1 = position._M_dataplus._M_p;
        (__return_storage_ptr__->quanta).ions = (undefined4)position._M_string_length;
        (__return_storage_ptr__->quanta).excitons = position._M_string_length._4_4_;
      }
      else {
        uVar25 = -(ulong)((double)local_148._0_8_ < (double)local_218._0_8_ + local_150);
        auVar37._0_8_ = ~uVar25 & local_218._0_8_;
        auVar37._8_8_ = ~local_148._8_8_ & local_218._8_8_;
        auVar10._8_4_ = 0;
        auVar10._0_8_ = (ulong)((double)local_148._0_8_ - local_150) & uVar25;
        auVar10._12_4_ = 0x80000000;
        local_218 = auVar37 | auVar10;
        pdVar18 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar32 = local_218._0_8_;
        if (0.0 <= *pdVar18) {
          (*this->_vptr_NESTcalc[10])
                    (dVar32,SUB84(dVar2,0),dVar31,0x3ff0000000000000,&position,this,
                     &default_ERYieldsParam);
          (__return_storage_ptr__->yields).ElectricField = local_108;
          (__return_storage_ptr__->yields).DeltaT_Scint = dStack_100;
          (__return_storage_ptr__->yields).ExcitonRatio =
               (double)position.field_2._M_allocated_capacity;
          (__return_storage_ptr__->yields).Lindhard = (double)position.field_2._8_8_;
          (__return_storage_ptr__->yields).PhotonYield = (double)position._M_dataplus._M_p;
          (__return_storage_ptr__->yields).ElectronYield = (double)position._M_string_length;
          pdVar18 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          local_158 = dVar32 * -*pdVar18;
          dVar39 = local_158 / (pdVar18[1] + 1.0);
          dVar30 = pdVar18[3];
          dVar29 = pow(dVar32,pdVar18[4] + -1.0);
          local_1c8 = dVar29 * dVar30 * 0.25 * dVar39;
          pdVar6 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar30 = pdVar6[1];
          dVar29 = log(pdVar6[2] + local_1c8);
          dVar39 = ((dVar30 + 1.0) - dVar29 / local_1c8) * dVar39;
          pdVar18 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar30 = pdVar18[1];
          (__return_storage_ptr__->yields).PhotonYield = dVar39;
          (__return_storage_ptr__->yields).ElectronYield = local_158 - dVar39;
          (__return_storage_ptr__->yields).ExcitonRatio = dVar30;
          (__return_storage_ptr__->yields).Lindhard = 1.0;
          (__return_storage_ptr__->yields).ElectricField = dVar31;
          (__return_storage_ptr__->yields).DeltaT_Scint = -999.0;
        }
        if (0.0 < *pdVar18 || *pdVar18 == 0.0) goto LAB_0010703b;
        iVar19 = 0;
        uVar23 = 0;
        if (1.0 <= local_158) {
          pRVar16 = RandomGen::rndm();
          dVar32 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[5] * dVar32;
          iVar17 = RandomGen::binom_draw(pRVar16,(long)dVar32,local_158 / dVar32);
          uVar23 = (uint)iVar17;
          pdVar18 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        log(pdVar18[2] + local_1c8);
        if ((0 < (int)uVar23) &&
           (1.0 < (__return_storage_ptr__->yields).PhotonYield ||
            (__return_storage_ptr__->yields).PhotonYield == 1.0)) {
          pRVar16 = RandomGen::rndm();
          iVar17 = RandomGen::binom_draw
                             (pRVar16,(ulong)uVar23,
                              (__return_storage_ptr__->yields).PhotonYield / (double)(int)uVar23);
          iVar19 = (int)iVar17;
        }
        pdVar6 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar30 = ceil((double)(int)uVar23 / (pdVar6[1] + 1.0) + -0.5);
        dVar39 = log(pdVar6[2] + local_1c8);
        dVar31 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[6];
        dVar32 = (__return_storage_ptr__->yields).PhotonYield;
        (__return_storage_ptr__->quanta).photons = iVar19;
        (__return_storage_ptr__->quanta).electrons = uVar23 - iVar19;
        (__return_storage_ptr__->quanta).ions = (int)dVar30;
        (__return_storage_ptr__->quanta).excitons = uVar23 - (int)dVar30;
        (__return_storage_ptr__->quanta).recombProb = 1.0 - dVar39 / local_1c8;
        (__return_storage_ptr__->quanta).Variance = dVar31 * dVar32;
        local_21c = local_21c + (uVar23 - iVar19);
      }
      if (a <= 0.0) {
        iVar19 = pQVar1->photons;
        if (0.0 <= *(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start) {
          iVar5 = (__return_storage_ptr__->quanta).electrons;
          pRVar16 = RandomGen::rndm();
          dVar31 = (double)(iVar5 + iVar19);
          if (dVar31 < 0.0) {
            dVar32 = sqrt(dVar31);
          }
          else {
            dVar32 = SQRT(dVar31);
          }
          dVar31 = RandomGen::rand_gauss(pRVar16,dVar31,dVar32,false);
          dVar32 = floor(dVar31 + 0.5);
          pRVar16 = RandomGen::rndm();
          iVar19 = pQVar1->photons;
          dVar31 = (double)iVar19 * 200.0;
          if (dVar31 < 0.0) {
            dVar31 = sqrt(dVar31);
          }
          else {
            dVar31 = SQRT(dVar31);
          }
          dVar31 = RandomGen::rand_gauss(pRVar16,(double)iVar19,dVar31,false);
          dVar31 = floor(dVar31 + 0.5);
          iVar19 = (int)dVar31;
          (__return_storage_ptr__->quanta).photons = iVar19;
          (__return_storage_ptr__->quanta).electrons = (int)dVar32 - iVar19;
        }
        iVar24 = iVar24 + iVar19;
      }
      else {
        iVar24 = (int)((double)pQVar1->photons * ((double)local_218._0_8_ / local_178) +
                      (double)iVar24);
      }
      dVar31 = floor(local_1b8 / dVar3 + 0.5);
      pdVar6 = (vTable->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (vTable->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar25 = (long)pdVar8 - (long)pdVar6 >> 3;
      uVar22 = (int)uVar25 - 1;
      pNVar15 = (NESTcalc *)(ulong)uVar22;
      uVar23 = (int)dVar31;
      if (uVar25 <= (ulong)(long)(int)dVar31) {
        uVar23 = uVar22;
      }
      pdVar21 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start + 7;
      pdVar18 = pdVar6 + (int)uVar23;
      if (pdVar8 == pdVar6) {
        pdVar18 = pdVar21;
      }
      pVVar7 = this->fdetector;
      if ((pVVar7->cathode <= local_1b8) &&
         (0.0 <= *(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start)) {
        dVar31 = (double)(__return_storage_ptr__->quanta).electrons;
        dVar32 = exp((-(pVVar7->TopDrift - local_1b8) / *pdVar18) / pVVar7->eLife_us);
        if (a <= 0.0) {
          dVar31 = dVar31 * dVar32;
        }
        else {
          dVar31 = dVar32 * dVar31 * ((double)local_218._0_8_ / local_178);
        }
        local_21c = (int)(dVar31 + (double)local_21c);
      }
      local_150 = local_150 + (double)local_218._0_8_;
      dVar36 = dVar36 + dVar27;
      dStack_80 = auVar9._8_8_;
      dVar38 = dVar38 + dStack_80;
      local_1b8 = local_1b8 + (dVar40 / dVar4) * dVar3;
    } while (0.0 <= a);
    local_178 = local_178 - (double)local_218._0_8_;
    pdVar6 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_218._0_8_ = pdVar6[10];
    if ((double)local_218._0_8_ <= 0.0) {
LAB_001073b6:
      local_218._0_8_ =
           CalcElectronLET(pNVar15,local_178,(int)pdVar21,
                           (bool)(-((double)local_218._0_8_ != 0.0) & 1));
      local_218._8_8_ = extraout_XMM0_Qb_00;
    }
    else {
      dVar31 = pdVar6[0xb];
      if ((dVar31 == 0.0) && (!NAN(dVar31))) goto LAB_001073b6;
      dVar31 = pow(local_178,dVar31);
      local_218._0_8_ = (double)local_218._0_8_ * dVar31;
      local_218._8_8_ = 0;
      if (0.0 < (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[0xc]) {
        pRVar16 = RandomGen::rndm();
        local_218._0_8_ =
             RandomGen::rand_gauss
                       (pRVar16,(double)local_218._0_8_,
                        (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[0xc] * (double)local_218._0_8_,true);
        local_218._8_8_ = extraout_XMM0_Qb;
      }
    }
    local_218._0_8_ = (double)local_218._0_8_ * dVar2 * dVar3 * 100.0;
  } while( true );
}

Assistant:

NESTresult NESTcalc::GetYieldERdEOdxBasis(
    const std::vector<double> &dEOdxParam, string muonInitPos,
    vector<double> vTable, const std::vector<double> &NRERWidthsParam) {
  Wvalue wvalue = WorkFunction(dEOdxParam[8], fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double rho = dEOdxParam[8];
  double xi = -999., yi = -999., zi = fdetector->get_TopDrift();
  double xf, yf, zf, pos_x, pos_y, pos_z, r, phi, field,
      eMin = dEOdxParam[4], z_step = dEOdxParam[5], inField = dEOdxParam[6];
  if (ValidityTests::nearlyEqual(eMin, 0.) || std::isnan(eMin))
    throw std::runtime_error("Energy cannot be zero or undefined");
  NESTresult result{};
  xf = dEOdxParam[0];
  yf = dEOdxParam[1];
  zf = dEOdxParam[2];
  if (ValidityTests::nearlyEqual(dEOdxParam[3], -1.)) {
    if (NRERWidthsParam[0] < 0. && eMin < 0.) {
      xi = xf - 10.;
      yi = yf;
      zi = zf;
    } else {
      r = fdetector->get_radmax() * sqrt(RandomGen::rndm()->rand_uniform());
      phi = 2. * M_PI * RandomGen::rndm()->rand_uniform();
      xi = r * cos(phi);
      yi = r * sin(phi);
    }
  } else {
    string position = muonInitPos;
    string delimiter = ",";
    size_t loc = 0;
    int ii = 0;
    while ((loc = position.find(delimiter)) != string::npos) {
      string token = position.substr(0, loc);
      if (ii == 0)
        xi = stof(token);
      else
        yi = stof(token);
      position.erase(0, loc + delimiter.length());
      ++ii;
    }
    zi = stof(position);
  }
  if (zi <= 0.) zi = fdetector->get_TopDrift();
  double dEOdx, eStep, refEnergy;
  if (eMin < 0.) {
    refEnergy = -eMin;
    if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
      dEOdx = dEOdxParam[10] * pow(-eMin, dEOdxParam[11]);
      if (dEOdxParam[12] > 0.)
	; //do nothing yet. Old attempts: Gaussian, Expo, Poisson
    } else
      dEOdx = CalcElectronLET(-eMin, ATOM_NUM, dEOdxParam[10]);
    eStep = rho * z_step * 1e2 * RandomGen::rndm()->rand_zero_trunc_gauss(dEOdx,dEOdx);
  } else {
    refEnergy = dEOdxParam[9];
    eStep = eMin * rho * z_step * 1e2;
  }
  double driftTime, vD, keV = 0., Nq_mean;
  int Nph = 0, Ne = 0, Nq = 0;
  double xx = xi, yy = yi, zz = zi;
  if (zf < 0.) zf = 0.;
  double distance = sqrt((xf - xi) * (xf - xi) + (yf - yi) * (yf - yi) +
                         (zf - zi) * (zf - zi));
  double norm[3];
  double xi_tib;
  norm[0] = (xf - xi) / distance;
  norm[1] = (yf - yi) / distance;
  norm[2] = (zf - zi) / distance;
  bool stopCond = false;
  while (!stopCond &&
         (xx * xx + yy * yy) <
             fdetector->get_radmax() * fdetector->get_radmax() &&
         std::abs(refEnergy) > PHE_MIN) {
    if (((zf < zi && zz <= zf) || (zf > zi && zz >= zf)) &&
        ((xx - xf) * (xx - xf) + (yy - yf) * (yy - yf)) <
            4. * z_step * z_step) {
      stopCond = true;
      break;
    }
    // stop making S1 and S2 if particle exits Xe volume, OR runs out of
    // energy (in case of beta)
    if (inField == -1.)
      field = fdetector->FitEF(xx, yy, zz);
    else
      field = inField;
    if (eMin < 0.) {
      if ((keV + eStep) > -eMin) eStep = -eMin - keV;
      if (NRERWidthsParam[0] < 0.) {
        YieldResult yields{};
        Nq_mean = -NRERWidthsParam[0] * eStep;
        double Ni_mean = Nq_mean / (1. + NRERWidthsParam[1]);
        xi_tib = Ni_mean * (NRERWidthsParam[3] / 4.) *
                 pow(eStep, NRERWidthsParam[4] - 1.);
        yields.PhotonYield =
            Ni_mean * (1. + NRERWidthsParam[1] -
                       log(NRERWidthsParam[2] + xi_tib) / xi_tib);
        yields.ElectronYield = Nq_mean - yields.PhotonYield;
        yields.ExcitonRatio = NRERWidthsParam[1];
        yields.Lindhard = 1.;
        yields.ElectricField = field;
        yields.DeltaT_Scint = -999;
        result.yields = yields;
      } else
        result.yields = GetYieldBetaGR(eStep, rho, field);
    } else {
      result.yields = GetYieldBetaGR(refEnergy, rho, field);
    }
    if (eMin < 0. && NRERWidthsParam[0] < 0.) {
      QuantaResult quanta{};
      if (Nq_mean < 1.)
        Nq = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(Nq_mean,sqrt(NRERWidthsParam[5]*Nq_mean),true)-0.5))
        Nq = RandomGen::rndm()->binom_draw(NRERWidthsParam[5]*eStep,Nq_mean/(NRERWidthsParam[5]*eStep));
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      if (result.yields.PhotonYield < 1. || Nq <= 0)
        quanta.photons = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(result.yields.PhotonYield,sqrt(NRERWidthsParam[6]*result.yields.PhotonYield),true)-0.5))
        quanta.photons = RandomGen::rndm()->binom_draw(Nq,result.yields.PhotonYield/double(Nq));
      quanta.electrons = Nq - quanta.photons;
      quanta.ions = int(ceil(double(Nq) / (1. + NRERWidthsParam[1]) - 0.5));
      quanta.excitons = Nq - quanta.ions;
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      quanta.Variance = NRERWidthsParam[6] * result.yields.PhotonYield;
      result.quanta = quanta;
      Ne += result.quanta.electrons;
    } else
      result.quanta =
          GetQuanta(result.yields, rho, default_NRERWidthsParam, -999.);
    if (eMin > 0.)
      Nph += result.quanta.photons * (eStep / refEnergy);
    else {
      if (NRERWidthsParam[0] >= 0.) {
        Nq = result.quanta.photons + result.quanta.electrons;
        double FanoOverall =
            1.;  // use 6 for ~0.7% energy resolution at 2.6 MeV and 190 V/cm
        double FanoScint =
            200.;  // standin for recombination fluctuations in this approach
        Nq = int(floor(
            RandomGen::rndm()->rand_gauss(Nq, sqrt(FanoOverall * Nq), false) +
            0.5));
        result.quanta.photons =
            int(floor(RandomGen::rndm()->rand_gauss(
                          result.quanta.photons,
                          sqrt(FanoScint * result.quanta.photons), false) +
                      0.5));
        result.quanta.electrons = Nq - result.quanta.photons;
      }
      Nph += result.quanta.photons;
    }
    int index = int(floor(zz / z_step + 0.5));
    if (index >= vTable.size()) index = vTable.size() - 1;
    if (vTable.size() == 0)
      vD = dEOdxParam[7];
    else
      vD = vTable[index];
    driftTime = (fdetector->get_TopDrift() - zz) / vD;
    if (zz >= fdetector->get_cathode() && NRERWidthsParam[0] >= 0.) {
      if (eMin > 0.)
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us()) * (eStep / refEnergy);
      else
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us());
    }
    keV += eStep;
    xx += norm[0] * z_step;
    yy += norm[1] * z_step;
    zz += norm[2] * z_step;
    if (eMin < 0.) {
      refEnergy -= eStep;
      if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
        dEOdx = dEOdxParam[10] * pow(refEnergy, dEOdxParam[11]);
        if (dEOdxParam[12] > 0.)
          dEOdx = RandomGen::rndm()->rand_gauss(dEOdx, dEOdxParam[12] * dEOdx,
                                                true);
      } else
        dEOdx = CalcElectronLET(refEnergy, ATOM_NUM, dEOdxParam[10]);
      eStep = dEOdx * rho * z_step * 1e2;
    }
    // cerr << keV << "\t\t" << xx << "\t" << yy << "\t" << zz << "\t" << Nph <<
    // "\t" << Ne << endl;
  }
  if (Nph < 0) Nph = 0;
  if (Ne < 0) Ne = 0;
  result.quanta.photons = Nph;
  result.quanta.electrons = Ne;
  pos_x =
      0.5 * (xi + xx);  // approximate things not already done right in loop as
  // middle of detector since muon traverses whole length
  pos_y = 0.5 * (yi + yy);
  pos_z = 0.5 * (zi + zz);
  if (inField == -1.)
    field = fdetector->FitEF(pos_x, pos_y, pos_z);
  else
    field = inField;
  result.yields.DeltaT_Scint = pos_z;
  result.yields.ElectricField = field;
  return result;
}